

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

void buffer_empty(Buffer *buffer)

{
  BufferBlock *pBVar1;
  BufferBlock *next;
  BufferBlock *item;
  Buffer *buffer_local;
  
  next = buffer->head;
  while (next != (BufferBlock *)0x0) {
    pBVar1 = next->next;
    (*buffer->f)(next,buffer->d);
    next = pBVar1;
  }
  buffer->tail = (BufferBlock *)0x0;
  buffer->head = (BufferBlock *)0x0;
  buffer->total_bytes = 0;
  return;
}

Assistant:

void buffer_empty(Buffer *buffer)
{
    BufferBlock *item = buffer->head;
    while (item != NULL)
    {
        BufferBlock *next = item->next;
        buffer->f(item, buffer->d);
        item = next;
    } // while
    buffer->head = buffer->tail = NULL;
    buffer->total_bytes = 0;
}